

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::SessionImpl
          (SessionImpl *this,Pimpl *v,
          unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_> *p)

{
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__SessionImpl_002fc958;
  this->maxBlockSize = 0;
  this->venue = v;
  TaskThread::Queue::Queue(&this->taskQueue,&v->taskThread);
  (this->performer)._M_t.
  super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
  super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
  super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl =
       (p->_M_t).super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
       super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
       super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
  (p->_M_t).super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
  super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
  super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl = (Performer *)0x0;
  (this->state)._M_i = empty;
  memset(&this->totalFramesRendered,0,0x88);
  if ((this->performer)._M_t.
      super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
      super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
      super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl != (Performer *)0x0) {
    TaskThread::Queue::attach(&this->taskQueue);
    return;
  }
  throwInternalCompilerError("performer != nullptr","SessionImpl",0xdd);
}

Assistant:

SessionImpl (Pimpl& v, std::unique_ptr<soul::Performer> p)
            : venue (v),
              taskQueue (venue.taskThread),
              performer (std::move (p))
        {
            SOUL_ASSERT (performer != nullptr);
            taskQueue.attach();
        }